

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

void j2k_write_poc(opj_j2k_t *j2k)

{
  OPJ_UINT32 OVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  OPJ_UINT32 OVar6;
  opj_tcp_t *poVar7;
  opj_tccp_t *poVar8;
  opj_cio_t *cio;
  int iVar9;
  OPJ_UINT32 OVar10;
  long lVar11;
  int n;
  
  OVar1 = j2k->image->numcomps;
  poVar7 = j2k->cp->tcps;
  iVar2 = j2k->curtileno;
  poVar8 = poVar7[iVar2].tccps;
  cio = j2k->cio;
  uVar3 = poVar7[iVar2].numpocs;
  cio_write(cio,0xff5f,2);
  cio_write(cio,(long)(int)(((uint)(0x100 < (int)OVar1) * 2 + 7) * (uVar3 + 1) + 2),2);
  if (-1 < (int)uVar3) {
    n = (0x100 < (int)OVar1) + 1;
    lVar11 = 0;
    do {
      cio_write(cio,(ulong)*(uint *)(poVar7[iVar2].pocs[0].progorder + lVar11 + -0x28),1);
      cio_write(cio,(ulong)*(uint *)(poVar7[iVar2].pocs[0].progorder + lVar11 + -0x24),n);
      cio_write(cio,(ulong)*(uint *)(poVar7[iVar2].pocs[0].progorder + lVar11 + -0x20),2);
      iVar4 = *(int *)(poVar7[iVar2].pocs[0].progorder + lVar11 + -0x20);
      uVar5 = *(uint *)(poVar7[iVar2].pocs[0].progorder + lVar11 + -0x1c);
      iVar9 = poVar7[iVar2].numlayers;
      if (iVar4 < poVar7[iVar2].numlayers) {
        iVar9 = iVar4;
      }
      *(int *)(poVar7[iVar2].pocs[0].progorder + lVar11 + -0x20) = iVar9;
      cio_write(cio,(ulong)uVar5,1);
      OVar10 = poVar8->numresolutions;
      OVar6 = *(OPJ_UINT32 *)(poVar7[iVar2].pocs[0].progorder + lVar11 + -0x1c);
      uVar5 = *(uint *)(poVar7[iVar2].pocs[0].progorder + lVar11 + -0x18);
      if ((int)OVar6 < (int)OVar10) {
        OVar10 = OVar6;
      }
      *(OPJ_UINT32 *)(poVar7[iVar2].pocs[0].progorder + lVar11 + -0x1c) = OVar10;
      cio_write(cio,(ulong)uVar5,n);
      OVar10 = *(OPJ_UINT32 *)(poVar7[iVar2].pocs[0].progorder + lVar11 + -0x18);
      if ((int)OVar1 <= (int)OVar10) {
        OVar10 = OVar1;
      }
      *(OPJ_UINT32 *)(poVar7[iVar2].pocs[0].progorder + lVar11 + -0x18) = OVar10;
      cio_write(cio,(long)*(int *)(poVar7[iVar2].pocs[0].progorder + lVar11 + -4),1);
      lVar11 = lVar11 + 0x94;
    } while ((ulong)uVar3 * 0x94 + 0x94 != lVar11);
  }
  return;
}

Assistant:

static void j2k_write_poc(opj_j2k_t *j2k) {
	int len, numpchgs, i;

	int numcomps = j2k->image->numcomps;
	
	opj_cp_t *cp = j2k->cp;
	opj_tcp_t *tcp = &cp->tcps[j2k->curtileno];
	opj_tccp_t *tccp = &tcp->tccps[0];
	opj_cio_t *cio = j2k->cio;

	numpchgs = 1 + tcp->numpocs;
	cio_write(cio, J2K_MS_POC, 2);	/* POC  */
	len = 2 + (5 + 2 * (numcomps <= 256 ? 1 : 2)) * numpchgs;
	cio_write(cio, len, 2);		/* Lpoc */
	for (i = 0; i < numpchgs; i++) {
		opj_poc_t *poc = &tcp->pocs[i];
		cio_write(cio, poc->resno0, 1);	/* RSpoc_i */
		cio_write(cio, poc->compno0, (numcomps <= 256 ? 1 : 2));	/* CSpoc_i */
		cio_write(cio, poc->layno1, 2);	/* LYEpoc_i */
		poc->layno1 = int_min(poc->layno1, tcp->numlayers);
		cio_write(cio, poc->resno1, 1);	/* REpoc_i */
		poc->resno1 = int_min(poc->resno1, tccp->numresolutions);
		cio_write(cio, poc->compno1, (numcomps <= 256 ? 1 : 2));	/* CEpoc_i */
		poc->compno1 = int_min(poc->compno1, numcomps);
		cio_write(cio, poc->prg, 1);	/* Ppoc_i */
	}
}